

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O1

char * __thiscall opencollada::MissingArgumentException::what(MissingArgumentException *this)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  psVar1 = &this->mWhat;
  ::std::__cxx11::string::_M_replace
            ((ulong)psVar1,0,(char *)(this->mWhat)._M_string_length,0x147475);
  if ((this->mParam)._M_string_length != 0) {
    ::std::operator+(&local_30,": ",&this->mParam);
    ::std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

virtual const char* what() const NOEXCEPT override
        {
			mWhat = "Missing argument";
			if (mParam.length() > 0)
				mWhat += ": " + mParam;
            return mWhat.c_str();
        }